

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_image_t *
add_grain_if_needed(aom_codec_alg_priv_t *ctx,aom_image_t *img,aom_image_t *grain_img,
                   aom_film_grain_t *grain_params)

{
  size_t sVar1;
  BufferPool *pBVar2;
  int iVar3;
  aom_image_t *paVar4;
  AllocCbParam param;
  BufferPool *local_40;
  aom_codec_frame_buffer_t *local_38;
  
  if (grain_params->apply_grain != 0) {
    sVar1 = ctx->num_grain_image_frame_buffers;
    pBVar2 = ctx->buffer_pool;
    local_40 = pBVar2;
    local_38 = ctx->grain_image_frame_buffers + sVar1;
    paVar4 = aom_img_alloc_with_cb
                       (grain_img,img->fmt,img->d_w + 1 & 0xfffffffe,img->d_h + 1 & 0xfffffffe,0x10,
                        AllocWithGetFrameBufferCb,&local_40);
    if (paVar4 != (aom_image_t *)0x0) {
      grain_img->user_priv = img->user_priv;
      grain_img->fb_priv = ctx->grain_image_frame_buffers[sVar1].priv;
      iVar3 = av1_add_film_grain(grain_params,img,grain_img);
      if (iVar3 == 0) {
        ctx->num_grain_image_frame_buffers = ctx->num_grain_image_frame_buffers + 1;
        return grain_img;
      }
      (*pBVar2->release_fb_cb)(pBVar2->cb_priv,ctx->grain_image_frame_buffers + sVar1);
    }
    img = (aom_image_t *)0x0;
  }
  return img;
}

Assistant:

static aom_image_t *add_grain_if_needed(aom_codec_alg_priv_t *ctx,
                                        aom_image_t *img,
                                        aom_image_t *grain_img,
                                        aom_film_grain_t *grain_params) {
  if (!grain_params->apply_grain) return img;

  const int w_even = ALIGN_POWER_OF_TWO_UNSIGNED(img->d_w, 1);
  const int h_even = ALIGN_POWER_OF_TWO_UNSIGNED(img->d_h, 1);

  BufferPool *const pool = ctx->buffer_pool;
  aom_codec_frame_buffer_t *fb =
      &ctx->grain_image_frame_buffers[ctx->num_grain_image_frame_buffers];
  AllocCbParam param;
  param.pool = pool;
  param.fb = fb;
  if (!aom_img_alloc_with_cb(grain_img, img->fmt, w_even, h_even, 16,
                             AllocWithGetFrameBufferCb, &param)) {
    return NULL;
  }

  grain_img->user_priv = img->user_priv;
  grain_img->fb_priv = fb->priv;
  if (av1_add_film_grain(grain_params, img, grain_img)) {
    pool->release_fb_cb(pool->cb_priv, fb);
    return NULL;
  }

  ctx->num_grain_image_frame_buffers++;
  return grain_img;
}